

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void prvTidyBumpObject(TidyDocImpl *doc,Node *html)

{
  TidyTagId TVar1;
  Bool BVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *node;
  Node *element;
  
  if ((html != (Node *)0x0) && (pNVar4 = html->content, pNVar4 != (Node *)0x0)) {
    element = (Node *)0x0;
    pNVar3 = (Node *)0x0;
    do {
      if (pNVar4->tag != (Dict *)0x0) {
        TVar1 = pNVar4->tag->id;
        if (TVar1 == TidyTag_HEAD) {
          pNVar3 = pNVar4;
        }
        if (TVar1 == TidyTag_BODY) {
          element = pNVar4;
        }
      }
      pNVar4 = pNVar4->next;
    } while (pNVar4 != (Node *)0x0);
    if ((pNVar3 != (Node *)0x0) && (element != (Node *)0x0)) {
      pNVar4 = pNVar3->content;
LAB_0014f1ed:
      pNVar3 = pNVar4;
      if (pNVar3 != (Node *)0x0) {
        pNVar4 = pNVar3->next;
        if ((pNVar3->tag != (Dict *)0x0) && (pNVar3->tag->id == TidyTag_OBJECT)) {
          for (node = pNVar3->content; node != (Node *)0x0; node = node->next) {
            BVar2 = prvTidynodeIsText(node);
            if ((((BVar2 != no) && (BVar2 = prvTidyIsBlank(doc->lexer,pNVar3), BVar2 == no)) ||
                (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_PARAM)) {
              prvTidyRemoveNode(pNVar3);
              prvTidyInsertNodeAtStart(element,pNVar3);
              break;
            }
          }
        }
        goto LAB_0014f1ed;
      }
    }
  }
  return;
}

Assistant:

void TY_(BumpObject)( TidyDocImpl* doc, Node *html )
{
    Node *node, *next, *head = NULL, *body = NULL;

    if (!html)
        return;

    for ( node = html->content; node != NULL; node = node->next )
    {
        if ( nodeIsHEAD(node) )
            head = node;

        if ( nodeIsBODY(node) )
            body = node;
    }

    if ( head != NULL && body != NULL )
    {
        for (node = head->content; node != NULL; node = next)
        {
            next = node->next;

            if ( nodeIsOBJECT(node) )
            {
                Node *child;
                Bool bump = no;

                for (child = node->content; child != NULL; child = child->next)
                {
                    /* bump to body unless content is param */
                    if ( (TY_(nodeIsText)(child) && !TY_(IsBlank)(doc->lexer, node))
                         || !nodeIsPARAM(child) )
                    {
                            bump = yes;
                            break;
                    }
                }

                if ( bump )
                {
                    TY_(RemoveNode)( node );
                    TY_(InsertNodeAtStart)( body, node );
                }
            }
        }
    }
}